

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void AppendToStyleAttr(TidyDocImpl *doc,AttVal *styleattr,ctmbstr styleprop)

{
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var1;
  TidyAllocator *pTVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  tmbstr ptVar6;
  uint end;
  ctmbstr styleprop_local;
  AttVal *styleattr_local;
  TidyDocImpl *doc_local;
  
  uVar4 = prvTidytmbstrlen(styleattr->value);
  lVar3 = (long)uVar4;
  if ((uVar4 == 0) || (styleattr->value[uVar4 - 1] != ';')) {
    if ((uVar4 == 0) || (styleattr->value[uVar4 - 1] != '}')) {
      p_Var1 = doc->allocator->vtbl->realloc;
      pTVar2 = doc->allocator;
      ptVar6 = styleattr->value;
      uVar5 = prvTidytmbstrlen(styleprop);
      ptVar6 = (tmbstr)(*p_Var1)(pTVar2,ptVar6,lVar3 + (long)uVar5 + 3);
      styleattr->value = ptVar6;
      if (uVar4 != 0) {
        prvTidytmbstrcat(styleattr->value,"; ");
      }
      prvTidytmbstrcat(styleattr->value,styleprop);
    }
    else {
      p_Var1 = doc->allocator->vtbl->realloc;
      pTVar2 = doc->allocator;
      ptVar6 = styleattr->value;
      uVar4 = prvTidytmbstrlen(styleprop);
      ptVar6 = (tmbstr)(*p_Var1)(pTVar2,ptVar6,lVar3 + (long)uVar4 + 6);
      styleattr->value = ptVar6;
      prvTidytmbstrcat(styleattr->value," { ");
      prvTidytmbstrcat(styleattr->value,styleprop);
      prvTidytmbstrcat(styleattr->value," }");
    }
  }
  else {
    p_Var1 = doc->allocator->vtbl->realloc;
    pTVar2 = doc->allocator;
    ptVar6 = styleattr->value;
    uVar4 = prvTidytmbstrlen(styleprop);
    ptVar6 = (tmbstr)(*p_Var1)(pTVar2,ptVar6,lVar3 + (long)uVar4 + 2);
    styleattr->value = ptVar6;
    prvTidytmbstrcat(styleattr->value," ");
    prvTidytmbstrcat(styleattr->value,styleprop);
  }
  return;
}

Assistant:

static void AppendToStyleAttr( TidyDocImpl* doc, AttVal *styleattr, ctmbstr styleprop )
{
    /*
    this doesn't handle CSS comments and
    leading/trailing white-space very well
    see http://www.w3.org/TR/css-style-attr
    */
    uint end = TY_(tmbstrlen)(styleattr->value);

    if (end >0 && styleattr->value[end - 1] == ';')
    {
        /* attribute ends with declaration seperator */

        styleattr->value = (tmbstr) TidyDocRealloc(doc, styleattr->value,
            end + TY_(tmbstrlen)(styleprop) + 2);

        TY_(tmbstrcat)(styleattr->value, " ");
        TY_(tmbstrcat)(styleattr->value, styleprop);
    }
    else if (end >0 && styleattr->value[end - 1] == '}')
    {
        /* attribute ends with rule set */

        styleattr->value = (tmbstr) TidyDocRealloc(doc, styleattr->value,
            end + TY_(tmbstrlen)(styleprop) + 6);

        TY_(tmbstrcat)(styleattr->value, " { ");
        TY_(tmbstrcat)(styleattr->value, styleprop);
        TY_(tmbstrcat)(styleattr->value, " }");
    }
    else
    {
        /* attribute ends with property value */

        styleattr->value = (tmbstr) TidyDocRealloc(doc, styleattr->value,
            end + TY_(tmbstrlen)(styleprop) + 3);

        if (end > 0)
            TY_(tmbstrcat)(styleattr->value, "; ");
        TY_(tmbstrcat)(styleattr->value, styleprop);
    }
}